

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O0

ScalarFunction * duckdb::ReverseFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffe88;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffea0;
  LogicalType *local_108;
  LogicalType local_e0 [24];
  undefined1 local_c8 [32];
  LogicalType local_a8 [32];
  LogicalType *local_88;
  LogicalType local_80 [24];
  LogicalType *local_68;
  undefined8 local_60;
  undefined1 local_58 [47];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"reverse",&local_29);
  local_88 = local_80;
  duckdb::LogicalType::LogicalType(local_88,VARCHAR);
  local_68 = local_80;
  local_60 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe93abf);
  iVar1._M_len = (size_type)in_stack_fffffffffffffea0;
  iVar1._M_array = in_stack_fffffffffffffe98;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe90,iVar1,in_stack_fffffffffffffe88);
  duckdb::LogicalType::LogicalType(local_a8,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffea0,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)in_stack_fffffffffffffe98);
  duckdb::LogicalType::LogicalType(local_e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_28,local_58,local_a8,local_c8,0,0,0,0,local_e0,0,0,0);
  duckdb::LogicalType::~LogicalType(local_e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe93ba6);
  duckdb::LogicalType::~LogicalType(local_a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe93bc0);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe93bcd);
  local_108 = (LogicalType *)&local_68;
  do {
    local_108 = local_108 + -0x18;
    duckdb::LogicalType::~LogicalType(local_108);
  } while (local_108 != local_80);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return in_RDI;
}

Assistant:

ScalarFunction ReverseFun::GetFunction() {
	return ScalarFunction("reverse", {LogicalType::VARCHAR}, LogicalType::VARCHAR, ReverseFunction);
}